

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_setup_mct_encoding(opj_tcp_t *p_tcp,opj_image_t *p_image)

{
  opj_mct_data_t *poVar1;
  OPJ_BYTE *pOVar2;
  opj_mct_data_t *poVar3;
  void *ptr;
  OPJ_INT32 *pOVar4;
  opj_simple_mcc_decorrelation_data_t *poVar5;
  long lVar6;
  opj_mct_data_t **ppoVar7;
  uint uVar8;
  OPJ_UINT32 OVar9;
  
  if (p_tcp == (opj_tcp_t *)0x0) {
    __assert_fail("p_tcp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1dd8,"OPJ_BOOL opj_j2k_setup_mct_encoding(opj_tcp_t *, opj_image_t *)");
  }
  if (p_tcp->mct != 2) {
    return 1;
  }
  uVar8 = p_tcp->m_nb_mct_records;
  if (p_tcp->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
    if (uVar8 != p_tcp->m_nb_max_mct_records) {
LAB_0010f59a:
      poVar1 = p_tcp->m_mct_records + uVar8;
      pOVar2 = p_tcp->m_mct_records[uVar8].m_data;
      if (pOVar2 != (OPJ_BYTE *)0x0) {
        opj_free(pOVar2);
        poVar1->m_data = (OPJ_BYTE *)0x0;
      }
      poVar1->m_index = 1;
      poVar1->m_element_type = MCT_TYPE_FLOAT;
      poVar1->m_array_type = MCT_TYPE_DECORRELATION;
      OVar9 = p_image->numcomps * p_image->numcomps;
      uVar8 = OVar9 * 4;
      pOVar2 = (OPJ_BYTE *)opj_malloc((ulong)uVar8);
      poVar1->m_data = pOVar2;
      if (pOVar2 == (OPJ_BYTE *)0x0) {
        return 0;
      }
      (*j2k_mct_write_functions_from_float[poVar1->m_element_type])
                (p_tcp->m_mct_decoding_matrix,pOVar2,OVar9);
      poVar1->m_data_size = uVar8;
      uVar8 = p_tcp->m_nb_mct_records + 1;
      p_tcp->m_nb_mct_records = uVar8;
      OVar9 = 2;
      goto LAB_0010f62e;
    }
    p_tcp->m_nb_max_mct_records = uVar8 + 10;
    poVar1 = (opj_mct_data_t *)opj_realloc(p_tcp->m_mct_records,(ulong)(uVar8 + 10) << 5);
    if (poVar1 != (opj_mct_data_t *)0x0) {
      p_tcp->m_mct_records = poVar1;
      memset(poVar1 + p_tcp->m_nb_mct_records,0,
             (ulong)(p_tcp->m_nb_max_mct_records - p_tcp->m_nb_mct_records) << 5);
      uVar8 = p_tcp->m_nb_mct_records;
      goto LAB_0010f59a;
    }
LAB_0010f74d:
    ppoVar7 = &p_tcp->m_mct_records;
LAB_0010f754:
    opj_free(*ppoVar7);
    *ppoVar7 = (opj_mct_data_t *)0x0;
    ppoVar7[1] = (opj_mct_data_t *)0x0;
    return 0;
  }
  poVar1 = (opj_mct_data_t *)0x0;
  OVar9 = 1;
LAB_0010f62e:
  if (uVar8 == p_tcp->m_nb_max_mct_records) {
    p_tcp->m_nb_max_mct_records = uVar8 + 10;
    poVar3 = (opj_mct_data_t *)opj_realloc(p_tcp->m_mct_records,(ulong)(uVar8 + 10) << 5);
    if (poVar3 == (opj_mct_data_t *)0x0) goto LAB_0010f74d;
    p_tcp->m_mct_records = poVar3;
    uVar8 = p_tcp->m_nb_mct_records;
    memset(poVar3 + uVar8,0,(ulong)(p_tcp->m_nb_max_mct_records - uVar8) << 5);
    if (poVar1 != (opj_mct_data_t *)0x0) {
      poVar1 = poVar3 + ((ulong)uVar8 - 1);
    }
    uVar8 = p_tcp->m_nb_mct_records;
  }
  poVar3 = p_tcp->m_mct_records + uVar8;
  pOVar2 = p_tcp->m_mct_records[uVar8].m_data;
  if (pOVar2 != (OPJ_BYTE *)0x0) {
    opj_free(pOVar2);
    poVar3->m_data = (OPJ_BYTE *)0x0;
  }
  poVar3->m_index = OVar9;
  poVar3->m_element_type = MCT_TYPE_FLOAT;
  poVar3->m_array_type = MCT_TYPE_OFFSET;
  uVar8 = p_image->numcomps;
  pOVar2 = (OPJ_BYTE *)opj_malloc((ulong)(uVar8 * 4));
  poVar3->m_data = pOVar2;
  if (pOVar2 == (OPJ_BYTE *)0x0) {
    return 0;
  }
  ptr = opj_malloc((ulong)uVar8 * 4);
  if (ptr == (void *)0x0) {
    opj_free(poVar3->m_data);
    poVar3->m_data = (OPJ_BYTE *)0x0;
    return 0;
  }
  pOVar4 = &p_tcp->tccps->m_dc_level_shift;
  for (lVar6 = 0; uVar8 != (uint)lVar6; lVar6 = lVar6 + 1) {
    *(float *)((long)ptr + lVar6 * 4) = (float)*pOVar4;
    pOVar4 = pOVar4 + 0x10e;
  }
  (*j2k_mct_write_functions_from_float[poVar3->m_element_type])(ptr,poVar3->m_data,uVar8);
  opj_free(ptr);
  poVar3->m_data_size = uVar8 * 4;
  p_tcp->m_nb_mct_records = p_tcp->m_nb_mct_records + 1;
  uVar8 = p_tcp->m_nb_mcc_records;
  if (uVar8 == p_tcp->m_nb_max_mcc_records) {
    p_tcp->m_nb_max_mcc_records = uVar8 + 10;
    poVar5 = (opj_simple_mcc_decorrelation_data_t *)
             opj_realloc(p_tcp->m_mcc_records,(ulong)(uVar8 + 10) << 5);
    if (poVar5 == (opj_simple_mcc_decorrelation_data_t *)0x0) {
      ppoVar7 = (opj_mct_data_t **)&p_tcp->m_mcc_records;
      goto LAB_0010f754;
    }
    p_tcp->m_mcc_records = poVar5;
    memset(poVar5 + p_tcp->m_nb_mcc_records,0,
           (ulong)(p_tcp->m_nb_max_mcc_records - p_tcp->m_nb_mcc_records) << 5);
    uVar8 = p_tcp->m_nb_mcc_records;
  }
  poVar5 = p_tcp->m_mcc_records;
  poVar5[uVar8].m_decorrelation_array = poVar1;
  poVar5[uVar8].field_0x18 = poVar5[uVar8].field_0x18 | 1;
  poVar5[uVar8].m_nb_comps = p_image->numcomps;
  poVar5[uVar8].m_index = OVar9 + 1;
  poVar5[uVar8].m_offset_array = poVar3;
  p_tcp->m_nb_mcc_records = p_tcp->m_nb_mcc_records + 1;
  return 1;
}

Assistant:

OPJ_BOOL opj_j2k_setup_mct_encoding(opj_tcp_t * p_tcp, opj_image_t * p_image)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_indix = 1;
    opj_mct_data_t * l_mct_deco_data = 00, * l_mct_offset_data = 00;
    opj_simple_mcc_decorrelation_data_t * l_mcc_data;
    OPJ_UINT32 l_mct_size, l_nb_elem;
    OPJ_FLOAT32 * l_data, * l_current_data;
    opj_tccp_t * l_tccp;

    /* preconditions */
    assert(p_tcp != 00);

    if (p_tcp->mct != 2) {
        return OPJ_TRUE;
    }

    if (p_tcp->m_mct_decoding_matrix) {
        if (p_tcp->m_nb_mct_records == p_tcp->m_nb_max_mct_records) {
            opj_mct_data_t *new_mct_records;
            p_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;

            new_mct_records = (opj_mct_data_t *) opj_realloc(p_tcp->m_mct_records,
                              p_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
            if (! new_mct_records) {
                opj_free(p_tcp->m_mct_records);
                p_tcp->m_mct_records = NULL;
                p_tcp->m_nb_max_mct_records = 0;
                p_tcp->m_nb_mct_records = 0;
                /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to setup mct encoding\n"); */
                return OPJ_FALSE;
            }
            p_tcp->m_mct_records = new_mct_records;
            l_mct_deco_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

            memset(l_mct_deco_data, 0,
                   (p_tcp->m_nb_max_mct_records - p_tcp->m_nb_mct_records) * sizeof(
                       opj_mct_data_t));
        }
        l_mct_deco_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

        if (l_mct_deco_data->m_data) {
            opj_free(l_mct_deco_data->m_data);
            l_mct_deco_data->m_data = 00;
        }

        l_mct_deco_data->m_index = l_indix++;
        l_mct_deco_data->m_array_type = MCT_TYPE_DECORRELATION;
        l_mct_deco_data->m_element_type = MCT_TYPE_FLOAT;
        l_nb_elem = p_image->numcomps * p_image->numcomps;
        l_mct_size = l_nb_elem * MCT_ELEMENT_SIZE[l_mct_deco_data->m_element_type];
        l_mct_deco_data->m_data = (OPJ_BYTE*)opj_malloc(l_mct_size);

        if (! l_mct_deco_data->m_data) {
            return OPJ_FALSE;
        }

        j2k_mct_write_functions_from_float[l_mct_deco_data->m_element_type](
            p_tcp->m_mct_decoding_matrix, l_mct_deco_data->m_data, l_nb_elem);

        l_mct_deco_data->m_data_size = l_mct_size;
        ++p_tcp->m_nb_mct_records;
    }

    if (p_tcp->m_nb_mct_records == p_tcp->m_nb_max_mct_records) {
        opj_mct_data_t *new_mct_records;
        p_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;
        new_mct_records = (opj_mct_data_t *) opj_realloc(p_tcp->m_mct_records,
                          p_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
        if (! new_mct_records) {
            opj_free(p_tcp->m_mct_records);
            p_tcp->m_mct_records = NULL;
            p_tcp->m_nb_max_mct_records = 0;
            p_tcp->m_nb_mct_records = 0;
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to setup mct encoding\n"); */
            return OPJ_FALSE;
        }
        p_tcp->m_mct_records = new_mct_records;
        l_mct_offset_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

        memset(l_mct_offset_data, 0,
               (p_tcp->m_nb_max_mct_records - p_tcp->m_nb_mct_records) * sizeof(
                   opj_mct_data_t));

        if (l_mct_deco_data) {
            l_mct_deco_data = l_mct_offset_data - 1;
        }
    }

    l_mct_offset_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

    if (l_mct_offset_data->m_data) {
        opj_free(l_mct_offset_data->m_data);
        l_mct_offset_data->m_data = 00;
    }

    l_mct_offset_data->m_index = l_indix++;
    l_mct_offset_data->m_array_type = MCT_TYPE_OFFSET;
    l_mct_offset_data->m_element_type = MCT_TYPE_FLOAT;
    l_nb_elem = p_image->numcomps;
    l_mct_size = l_nb_elem * MCT_ELEMENT_SIZE[l_mct_offset_data->m_element_type];
    l_mct_offset_data->m_data = (OPJ_BYTE*)opj_malloc(l_mct_size);

    if (! l_mct_offset_data->m_data) {
        return OPJ_FALSE;
    }

    l_data = (OPJ_FLOAT32*)opj_malloc(l_nb_elem * sizeof(OPJ_FLOAT32));
    if (! l_data) {
        opj_free(l_mct_offset_data->m_data);
        l_mct_offset_data->m_data = 00;
        return OPJ_FALSE;
    }

    l_tccp = p_tcp->tccps;
    l_current_data = l_data;

    for (i = 0; i < l_nb_elem; ++i) {
        *(l_current_data++) = (OPJ_FLOAT32)(l_tccp->m_dc_level_shift);
        ++l_tccp;
    }

    j2k_mct_write_functions_from_float[l_mct_offset_data->m_element_type](l_data,
            l_mct_offset_data->m_data, l_nb_elem);

    opj_free(l_data);

    l_mct_offset_data->m_data_size = l_mct_size;

    ++p_tcp->m_nb_mct_records;

    if (p_tcp->m_nb_mcc_records == p_tcp->m_nb_max_mcc_records) {
        opj_simple_mcc_decorrelation_data_t *new_mcc_records;
        p_tcp->m_nb_max_mcc_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;
        new_mcc_records = (opj_simple_mcc_decorrelation_data_t *) opj_realloc(
                              p_tcp->m_mcc_records, p_tcp->m_nb_max_mcc_records * sizeof(
                                  opj_simple_mcc_decorrelation_data_t));
        if (! new_mcc_records) {
            opj_free(p_tcp->m_mcc_records);
            p_tcp->m_mcc_records = NULL;
            p_tcp->m_nb_max_mcc_records = 0;
            p_tcp->m_nb_mcc_records = 0;
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to setup mct encoding\n"); */
            return OPJ_FALSE;
        }
        p_tcp->m_mcc_records = new_mcc_records;
        l_mcc_data = p_tcp->m_mcc_records + p_tcp->m_nb_mcc_records;
        memset(l_mcc_data, 0, (p_tcp->m_nb_max_mcc_records - p_tcp->m_nb_mcc_records) *
               sizeof(opj_simple_mcc_decorrelation_data_t));

    }

    l_mcc_data = p_tcp->m_mcc_records + p_tcp->m_nb_mcc_records;
    l_mcc_data->m_decorrelation_array = l_mct_deco_data;
    l_mcc_data->m_is_irreversible = 1;
    l_mcc_data->m_nb_comps = p_image->numcomps;
    l_mcc_data->m_index = l_indix++;
    l_mcc_data->m_offset_array = l_mct_offset_data;
    ++p_tcp->m_nb_mcc_records;

    return OPJ_TRUE;
}